

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O1

char * CreateLlvmFunctionName(LlvmCompilationContext *ctx,FunctionData *function)

{
  TypeBase **ppTVar1;
  char *__src;
  long lVar2;
  MatchData *pMVar3;
  char *__dest;
  ulong uVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  undefined4 extraout_var;
  
  iVar5 = (*(int *)&(function->name->name).end - *(int *)&(function->name->name).begin) +
          (*(int *)&(function->type->super_TypeBase).name.end -
          *(int *)&(function->type->super_TypeBase).name.begin);
  iVar6 = iVar5 + 1;
  pMVar3 = (function->generics).head;
  if (pMVar3 != (MatchData *)0x0) {
    iVar6 = iVar5 + 2;
    do {
      ppTVar1 = &pMVar3->type;
      pMVar3 = pMVar3->next;
      iVar6 = (uint)(pMVar3 != (MatchData *)0x0) + iVar6 +
              (*(int *)&((*ppTVar1)->name).end - *(int *)&((*ppTVar1)->name).begin);
    } while (pMVar3 != (MatchData *)0x0);
  }
  iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)(iVar6 + 1));
  __dest = (char *)CONCAT44(extraout_var,iVar6);
  pcVar7 = (function->name->name).begin;
  memcpy(__dest,pcVar7,(ulong)(uint)(*(int *)&(function->name->name).end - (int)pcVar7));
  uVar4 = (ulong)(uint)(*(int *)&(function->name->name).end - *(int *)&(function->name->name).begin)
  ;
  __dest[uVar4] = '#';
  pcVar7 = (function->type->super_TypeBase).name.begin;
  memcpy(__dest + uVar4 + 1,pcVar7,
         (ulong)(uint)(*(int *)&(function->type->super_TypeBase).name.end - (int)pcVar7));
  lVar2 = (uint)(*(int *)&(function->type->super_TypeBase).name.end -
                *(int *)&(function->type->super_TypeBase).name.begin) + uVar4;
  pcVar7 = __dest + lVar2 + 1;
  if ((function->generics).head != (MatchData *)0x0) {
    *pcVar7 = '$';
    pcVar7 = __dest + lVar2 + 2;
    for (pMVar3 = (function->generics).head; pMVar3 != (MatchData *)0x0; pMVar3 = pMVar3->next) {
      __src = (pMVar3->type->name).begin;
      memcpy(pcVar7,__src,(ulong)(uint)(*(int *)&(pMVar3->type->name).end - (int)__src));
      pcVar7 = pcVar7 + (uint)(*(int *)&(pMVar3->type->name).end -
                              *(int *)&(pMVar3->type->name).begin);
      if (pMVar3->next != (MatchData *)0x0) {
        *pcVar7 = ',';
        pcVar7 = pcVar7 + 1;
      }
    }
  }
  *pcVar7 = '\0';
  return __dest;
}

Assistant:

char* CreateLlvmFunctionName(LlvmCompilationContext &ctx, FunctionData *function)
{
	unsigned length = function->name->name.length();
	length++; // '#'
	length += function->type->name.length();

	if(function->generics.head)
	{
		length++; // '$'

		for(MatchData *curr = function->generics.head; curr; curr = curr->next)
		{
			length += curr->type->name.length();

			if(curr->next)
				length++; // ','
		}
	}

	char *name = (char*)ctx.allocator->alloc(length + 1);

	char *pos = name;

	memcpy(pos, function->name->name.begin, function->name->name.length());
	pos += function->name->name.length();

	*pos++ = '#';

	memcpy(pos, function->type->name.begin, function->type->name.length());
	pos += function->type->name.length();

	if(function->generics.head)
	{
		*pos++ = '$';

		for(MatchData *curr = function->generics.head; curr; curr = curr->next)
		{
			memcpy(pos, curr->type->name.begin, curr->type->name.length());
			pos += curr->type->name.length();

			if(curr->next)
				*pos++ = ',';
		}
	}

	*pos = 0;

	return name;
}